

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_parse_mem(lys_module *module,lys_submodule *submodule,unres_schema *unres,char *data,
                  uint size_data,lys_node **node)

{
  int iVar1;
  size_t sVar2;
  YY_BUFFER_STATE new_buffer;
  uint uVar3;
  yang_parameter local_88;
  lys_node **local_48;
  unres_schema *local_40;
  yyscan_t local_38;
  yyscan_t scanner;
  
  local_38 = (yyscan_t)0x0;
  local_48 = node;
  local_40 = unres;
  if (size_data == 0) {
    sVar2 = strlen(data);
    size_data = (int)sVar2 + 2;
  }
  yylex_init(&local_38);
  new_buffer = yy_scan_buffer(data,(ulong)size_data,local_38);
  yy_switch_to_buffer(new_buffer,local_38);
  local_88.actual_node = (void **)0x0;
  local_88.value = (char **)0x0;
  local_88.data_node = (void **)0x0;
  local_88.unres = local_40;
  local_88.node = local_48;
  local_88._56_8_ = 1;
  local_88.module = module;
  local_88.submodule = submodule;
  iVar1 = yyparse(local_38,&local_88);
  if (iVar1 == 0) {
    uVar3 = 0;
  }
  else {
    if ((local_88._56_8_ & 1) != 0) {
      if (submodule != (lys_submodule *)0x0) {
        module = (lys_module *)submodule;
      }
      yang_free_import(module->ctx,module->imp,'\0',module->imp_size);
      yang_free_include(module->ctx,module->inc,'\0',module->inc_size);
      *(undefined2 *)&module->imp_size = 0;
    }
    uVar3 = -(uint)((local_88.flags & 2) == 0) | 1;
  }
  yy_delete_buffer(new_buffer,local_38);
  yylex_destroy(local_38);
  return uVar3;
}

Assistant:

int
yang_parse_mem(struct lys_module *module, struct lys_submodule *submodule, struct unres_schema *unres,
               const char *data, unsigned int size_data, struct lys_node **node)
{
    unsigned int size;
    YY_BUFFER_STATE bp;
    yyscan_t scanner = NULL;
    int ret = 0;
    struct lys_module *trg;
    struct yang_parameter param;

    size = (size_data) ? size_data : strlen(data) + 2;
    yylex_init(&scanner);
    bp = yy_scan_buffer((char *)data, size, scanner);
    yy_switch_to_buffer(bp, scanner);
    memset(&param, 0, sizeof param);
    param.module = module;
    param.submodule = submodule;
    param.unres = unres;
    param.node = node;
    param.flags |= YANG_REMOVE_IMPORT;
    if (yyparse(scanner, &param)) {
        if (param.flags & YANG_REMOVE_IMPORT) {
            trg = (submodule) ? (struct lys_module *)submodule : module;
            yang_free_import(trg->ctx, trg->imp, 0, trg->imp_size);
            yang_free_include(trg->ctx, trg->inc, 0, trg->inc_size);
            trg->inc_size = 0;
            trg->imp_size = 0;
        }
        ret = (param.flags & YANG_EXIST_MODULE) ? 1 : -1;
    }
    yy_delete_buffer(bp, scanner);
    yylex_destroy(scanner);
    return ret;
}